

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_bmp.c
# Opt level: O0

gdImagePtr gdImageCreateFromBmpCtx(gdIOCtxPtr infile)

{
  int iVar1;
  bmp_hdr_t *hdr_00;
  bmp_info_t *info_00;
  int local_34;
  gdImagePtr pgStack_30;
  int error;
  gdImagePtr im;
  bmp_info_t *info;
  bmp_hdr_t *hdr;
  gdIOCtxPtr infile_local;
  
  hdr_00 = (bmp_hdr_t *)gdCalloc(1,0x10);
  if (hdr_00 == (bmp_hdr_t *)0x0) {
    infile_local = (gdIOCtxPtr)0x0;
  }
  else {
    iVar1 = bmp_read_header(infile,hdr_00);
    if (iVar1 == 0) {
      if (hdr_00->magic == 0x4d42) {
        info_00 = (bmp_info_t *)gdCalloc(1,0x30);
        if (info_00 == (bmp_info_t *)0x0) {
          gdFree(hdr_00);
          infile_local = (gdIOCtxPtr)0x0;
        }
        else {
          iVar1 = bmp_read_info(infile,info_00);
          if (iVar1 == 0) {
            if (info_00->depth < 0x10) {
              pgStack_30 = gdImageCreate(info_00->width,info_00->height);
            }
            else {
              pgStack_30 = gdImageCreateTrueColor(info_00->width,info_00->height);
            }
            if (pgStack_30 == (gdImagePtr)0x0) {
              gdFree(hdr_00);
              gdFree(info_00);
              infile_local = (gdIOCtxPtr)0x0;
            }
            else {
              switch(info_00->depth) {
              case 1:
                local_34 = bmp_read_1bit(pgStack_30,infile,info_00,hdr_00);
                break;
              default:
                local_34 = 1;
                break;
              case 4:
                local_34 = bmp_read_4bit(pgStack_30,infile,info_00,hdr_00);
                break;
              case 8:
                local_34 = bmp_read_8bit(pgStack_30,infile,info_00,hdr_00);
                break;
              case 0x10:
              case 0x18:
              case 0x20:
                local_34 = bmp_read_direct(pgStack_30,infile,info_00,hdr_00);
              }
              gdFree(hdr_00);
              gdFree(info_00);
              if (local_34 == 0) {
                infile_local = (gdIOCtxPtr)pgStack_30;
              }
              else {
                gdImageDestroy(pgStack_30);
                infile_local = (gdIOCtxPtr)0x0;
              }
            }
          }
          else {
            gdFree(hdr_00);
            gdFree(info_00);
            infile_local = (gdIOCtxPtr)0x0;
          }
        }
      }
      else {
        gdFree(hdr_00);
        infile_local = (gdIOCtxPtr)0x0;
      }
    }
    else {
      gdFree(hdr_00);
      infile_local = (gdIOCtxPtr)0x0;
    }
  }
  return (gdImagePtr)infile_local;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreateFromBmpCtx(gdIOCtxPtr infile)
{
	bmp_hdr_t *hdr;
	bmp_info_t *info;
	gdImagePtr im = NULL;
	int error = 0;

	if (!(hdr= (bmp_hdr_t *)gdCalloc(1, sizeof(bmp_hdr_t)))) {
		return NULL;
	}

	if (bmp_read_header(infile, hdr)) {
		gdFree(hdr);
		return NULL;
	}

	if (hdr->magic != 0x4d42) {
		gdFree(hdr);
		return NULL;
	}

	if (!(info = (bmp_info_t *)gdCalloc(1, sizeof(bmp_info_t)))) {
		gdFree(hdr);
		return NULL;
	}

	if (bmp_read_info(infile, info)) {
		gdFree(hdr);
		gdFree(info);
		return NULL;
	}

	BMP_DEBUG(printf("Numcolours: %d\n", info->numcolors));
	BMP_DEBUG(printf("Width: %d\n", info->width));
	BMP_DEBUG(printf("Height: %d\n", info->height));
	BMP_DEBUG(printf("Planes: %d\n", info->numplanes));
	BMP_DEBUG(printf("Depth: %d\n", info->depth));
	BMP_DEBUG(printf("Offset: %d\n", hdr->off));

	if (info->depth >= 16) {
		im = gdImageCreateTrueColor(info->width, info->height);
	} else {
		im = gdImageCreate(info->width, info->height);
	}

	if (!im) {
		gdFree(hdr);
		gdFree(info);
		return NULL;
	}

	switch (info->depth) {
	case 1:
		BMP_DEBUG(printf("1-bit image\n"));
		error = bmp_read_1bit(im, infile, info, hdr);
		break;
	case 4:
		BMP_DEBUG(printf("4-bit image\n"));
		error = bmp_read_4bit(im, infile, info, hdr);
		break;
	case 8:
		BMP_DEBUG(printf("8-bit image\n"));
		error = bmp_read_8bit(im, infile, info, hdr);
		break;
	case 16:
	case 24:
	case 32:
		BMP_DEBUG(printf("Direct BMP image\n"));
		error = bmp_read_direct(im, infile, info, hdr);
		break;
	default:
		BMP_DEBUG(printf("Unknown bit count\n"));
		error = 1;
	}

	gdFree(hdr);
	gdFree(info);

	if (error) {
		gdImageDestroy(im);
		return NULL;
	}

	return im;
}